

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rotate(lua_State *L,int idx,int n)

{
  int iVar1;
  StkId to;
  TValue *from;
  StkId local_40;
  int local_34;
  StkId m;
  StkId t;
  StkId p;
  int n_local;
  int idx_local;
  lua_State *L_local;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xd6,"void lua_rotate(lua_State *, int, int)");
  }
  to = L->top + -1;
  from = index2addr(L,idx);
  if ((from == &luaO_nilobject_) || (idx < -0xf4627)) {
    __assert_fail("((((p) != (&luaO_nilobject_)) && !((idx) <= (-1000000 - 1000)))) && \"index not in the stack\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xd9,"void lua_rotate(lua_State *, int, int)");
  }
  local_34 = n;
  if (n < 0) {
    local_34 = -n;
  }
  if (((long)to - (long)from >> 4) + 1 < (long)local_34) {
    __assert_fail("((n >= 0 ? n : -n) <= (t - p + 1)) && \"invalid \'n\'\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xda,"void lua_rotate(lua_State *, int, int)");
  }
  if (n < 0) {
    local_40 = from + (-1 - (long)n);
  }
  else {
    local_40 = to + -(long)n;
  }
  reverse(L,from,local_40);
  reverse(L,local_40 + 1,to);
  reverse(L,from,to);
  iVar1 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar1;
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0xdf,"void lua_rotate(lua_State *, int, int)");
}

Assistant:

LUA_API void lua_rotate (lua_State *L, int idx, int n) {
  StkId p, t, m;
  lua_lock(L);
  t = L->top - 1;  /* end of stack segment being rotated */
  p = index2addr(L, idx);  /* start of segment */
  api_checkstackindex(L, idx, p);
  api_check(L, (n >= 0 ? n : -n) <= (t - p + 1), "invalid 'n'");
  m = (n >= 0 ? t - n : p - n - 1);  /* end of prefix */
  reverse(L, p, m);  /* reverse the prefix with length 'n' */
  reverse(L, m + 1, t);  /* reverse the suffix */
  reverse(L, p, t);  /* reverse the entire segment */
  lua_unlock(L);
}